

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Asyncify.cpp
# Opt level: O2

bool __thiscall wasm::anon_unknown_0::PatternMatcher::match(PatternMatcher *this,Name funcName)

{
  bool bVar1;
  size_type sVar2;
  _Base_ptr p_Var3;
  string local_68;
  undefined1 local_48 [8];
  Name funcName_local;
  
  funcName_local.super_IString.str._M_len = funcName.super_IString.str._M_str;
  local_48 = funcName.super_IString.str._M_len;
  sVar2 = std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::count
                    (&this->names,(key_type *)local_48);
  bVar1 = true;
  if (sVar2 == 0) {
    funcName_local.super_IString.str._M_str = (char *)this;
    for (p_Var3 = (this->patterns)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 != &(this->patterns)._M_t._M_impl.super__Rb_tree_header;
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
      IString::toString_abi_cxx11_(&local_68,(IString *)local_48);
      bVar1 = String::wildcardMatch((string *)(p_Var3 + 1),&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      if (bVar1) {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)(funcName_local.super_IString.str._M_str + 0x80),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var3 + 1)
                  );
        return true;
      }
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool match(Name funcName) {
    if (names.count(funcName) > 0) {
      return true;
    } else {
      for (auto& pattern : patterns) {
        if (String::wildcardMatch(pattern, funcName.toString())) {
          patternsMatched.insert(pattern);
          return true;
        }
      }
    }
    return false;
  }